

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

bool __thiscall
ImplicitDepLoader::LoadDepFile(ImplicitDepLoader *this,Edge *edge,string *path,string *err)

{
  size_t *len;
  size_t __n;
  pointer pcVar1;
  Metrics *this_00;
  Edge *edge_00;
  undefined8 this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var6;
  Node *pNVar7;
  undefined8 *puVar8;
  Metric *pMVar9;
  size_type *psVar10;
  ulong uVar11;
  _Alloc_hider this_02;
  ulong *puVar12;
  StringPiece *pSVar13;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint64_t slash_bits;
  string depfile_err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  DepfileParser depfile;
  string content;
  ScopedMetric metrics_h_scoped;
  uint64_t unused;
  ulong *local_178;
  undefined8 local_170;
  ulong local_168;
  undefined8 uStack_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  Edge *local_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  undefined1 local_d0 [24];
  StringPiece *pSStack_b8;
  StringPiece *local_b0;
  pointer local_a8;
  string local_98;
  Node **local_78;
  StringPiece *local_70;
  string local_68;
  ScopedMetric local_48;
  uint64_t local_38;
  
  if ((LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar9 = (Metric *)0x0;
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"depfile load","");
      pMVar9 = Metrics::NewMetric(this_00,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    LoadDepFile::metrics_h_metric = pMVar9;
    __cxa_guard_release(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_48,LoadDepFile::metrics_h_metric);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  iVar4 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[2])
                    (this->disk_interface_,path,&local_98,err);
  if (iVar4 == 1) {
    err->_M_string_length = 0;
    *(err->_M_dataplus)._M_p = '\0';
LAB_001193c1:
    if (local_98._M_string_length != 0) {
      DepfileParser::DepfileParser((DepfileParser *)local_d0);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity =
           local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar2 = DepfileParser::Parse((DepfileParser *)local_d0,&local_98,&local_138);
      this_01 = local_d0._0_8_;
      if (bVar2) {
        if (local_d0._0_8_ == local_d0._8_8_) {
          pcVar1 = (path->_M_dataplus)._M_p;
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,pcVar1,pcVar1 + path->_M_string_length);
          std::__cxx11::string::append((char *)&local_158);
          std::__cxx11::string::operator=((string *)err,(string *)&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          bVar2 = false;
        }
        else {
          len = (size_t *)(local_d0._0_8_ + 8);
          local_118 = edge;
          bVar2 = CanonicalizePath(*(char **)local_d0._0_8_,len,&local_38,err);
          if (bVar2) {
            pNVar7 = *(local_118->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            this_02._M_p = (pNVar7->path_)._M_dataplus._M_p;
            __n = (pNVar7->path_)._M_string_length;
            if ((__n == *len) &&
               (iVar4 = bcmp(this_02._M_p,*(char **)this_01,__n), edge_00 = local_118, iVar4 == 0))
            {
              pSVar13 = (StringPiece *)local_d0._0_8_;
              if (local_d0._0_8_ != local_d0._8_8_) {
                do {
                  this_02._M_p = (pointer)(edge_00->outputs_).
                                          super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start;
                  _Var6 = std::
                          __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<matches>>
                                    (this_02._M_p,
                                     (edge_00->outputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish,pSVar13);
                  if (_Var6._M_current ==
                      (edge_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    pcVar1 = (path->_M_dataplus)._M_p;
                    local_f0 = local_e0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_f0,pcVar1,pcVar1 + path->_M_string_length);
                    std::__cxx11::string::append((char *)&local_f0);
                    local_110 = &local_100;
                    if (pSVar13->len_ == 0) {
                      local_108 = 0;
                      local_100 = 0;
                    }
                    else {
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_110,pSVar13->str_,pSVar13->str_ + pSVar13->len_);
                    }
                    uVar11 = 0xf;
                    if (local_f0 != local_e0) {
                      uVar11 = local_e0[0];
                    }
                    if (uVar11 < (ulong)(local_108 + local_e8)) {
                      uVar11 = 0xf;
                      if (local_110 != &local_100) {
                        uVar11 = CONCAT71(uStack_ff,local_100);
                      }
                      if (uVar11 < (ulong)(local_108 + local_e8)) goto LAB_00119a4d;
                      puVar8 = (undefined8 *)
                               std::__cxx11::string::replace
                                         ((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
                    }
                    else {
LAB_00119a4d:
                      puVar8 = (undefined8 *)
                               std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
                    }
                    local_178 = &local_168;
                    puVar12 = puVar8 + 2;
                    if ((ulong *)*puVar8 == puVar12) {
                      local_168 = *puVar12;
                      uStack_160 = puVar8[3];
                    }
                    else {
                      local_168 = *puVar12;
                      local_178 = (ulong *)*puVar8;
                    }
                    local_170 = puVar8[1];
                    *puVar8 = puVar12;
                    puVar8[1] = 0;
                    *(undefined1 *)puVar12 = 0;
                    plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
                    psVar10 = (size_type *)(plVar5 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar5 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar10) {
                      local_158.field_2._M_allocated_capacity = *psVar10;
                      local_158.field_2._8_8_ = plVar5[3];
                      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                    }
                    else {
                      local_158.field_2._M_allocated_capacity = *psVar10;
                      local_158._M_dataplus._M_p = (pointer)*plVar5;
                    }
                    local_158._M_string_length = plVar5[1];
                    *plVar5 = (long)psVar10;
                    plVar5[1] = 0;
                    *(undefined1 *)(plVar5 + 2) = 0;
                    std::__cxx11::string::operator=((string *)err,(string *)&local_158);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_158._M_dataplus._M_p != &local_158.field_2) {
                      operator_delete(local_158._M_dataplus._M_p,
                                      local_158.field_2._M_allocated_capacity + 1);
                    }
                    if (local_178 != &local_168) {
                      operator_delete(local_178,local_168 + 1);
                    }
                    if (local_110 != &local_100) {
                      operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
                    }
                    puVar12 = local_f0;
                    if (local_f0 != local_e0) goto LAB_001197c0;
                    goto LAB_001197c8;
                  }
                  pSVar13 = pSVar13 + 1;
                } while (pSVar13 != (StringPiece *)local_d0._8_8_);
              }
              local_78 = (Node **)PreallocateSpace((ImplicitDepLoader *)this_02._M_p,edge_00,
                                                   (int)((ulong)((long)local_b0 - (long)pSStack_b8)
                                                        >> 4));
              local_70 = pSStack_b8;
              bVar2 = pSStack_b8 == local_b0;
              if (!bVar2) {
                lVar14 = 0;
                do {
                  pSVar13 = (StringPiece *)((long)&local_70->str_ + lVar14 * 2);
                  bVar3 = CanonicalizePath(pSVar13->str_,&pSVar13->len_,(uint64_t *)&local_158,err);
                  if (!bVar3) break;
                  pNVar7 = State::GetNode(this->state_,*pSVar13,(uint64_t)local_158._M_dataplus._M_p
                                         );
                  *(Node **)((long)local_78 + lVar14) = pNVar7;
                  Node::AddOutEdge(pNVar7,local_118);
                  CreatePhonyInEdge(this,pNVar7);
                  if (!bVar3) break;
                  lVar14 = lVar14 + 8;
                  bVar2 = pSVar13 + 1 == local_b0;
                } while (!bVar2);
              }
              goto LAB_001197d7;
            }
            if (g_explaining == true) {
              StringPiece::AsString_abi_cxx11_(&local_158,(StringPiece *)this_01);
              LoadDepFile();
            }
          }
          else {
            pcVar1 = (path->_M_dataplus)._M_p;
            local_178 = &local_168;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,pcVar1,pcVar1 + path->_M_string_length);
            std::__cxx11::string::append((char *)&local_178);
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_178,(ulong)(err->_M_dataplus)._M_p);
            psVar10 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_158.field_2._M_allocated_capacity = *psVar10;
              local_158.field_2._8_8_ = plVar5[3];
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar10;
              local_158._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_158._M_string_length = plVar5[1];
            *plVar5 = (long)psVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::operator=((string *)err,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            local_e0[0] = local_168;
            puVar12 = local_178;
            if (local_178 != &local_168) {
LAB_001197c0:
              operator_delete(puVar12,local_e0[0] + 1);
            }
          }
LAB_001197c8:
          bVar2 = false;
        }
      }
      else {
        pcVar1 = (path->_M_dataplus)._M_p;
        local_178 = &local_168;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,pcVar1,pcVar1 + path->_M_string_length);
        std::__cxx11::string::append((char *)&local_178);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_178,(ulong)local_138._M_dataplus._M_p);
        psVar10 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_158.field_2._M_allocated_capacity = *psVar10;
          local_158.field_2._8_8_ = plVar5[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar10;
          local_158._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_158._M_string_length = plVar5[1];
        *plVar5 = (long)psVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)err,(string *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        bVar2 = false;
      }
LAB_001197d7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (pSStack_b8 != (StringPiece *)0x0) {
        operator_delete(pSStack_b8,(long)local_a8 - (long)pSStack_b8);
      }
      if ((StringPiece *)local_d0._0_8_ != (StringPiece *)0x0) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ - local_d0._0_8_);
      }
      goto LAB_00119828;
    }
    if (g_explaining == true) {
      LoadDepFile((ImplicitDepLoader *)path);
    }
  }
  else {
    if (iVar4 != 2) goto LAB_001193c1;
    std::operator+(&local_158,"loading \'",path);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar12 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_138.field_2._M_allocated_capacity = *puVar12;
      local_138.field_2._8_8_ = plVar5[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar12;
      local_138._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_138._M_string_length = plVar5[1];
    *plVar5 = (long)puVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_138,(ulong)(err->_M_dataplus)._M_p);
    pSVar13 = (StringPiece *)(plVar5 + 2);
    if ((StringPiece *)*plVar5 == pSVar13) {
      local_d0._16_8_ = pSVar13->str_;
      pSStack_b8 = (StringPiece *)plVar5[3];
      local_d0._0_8_ = (StringPiece *)(local_d0 + 0x10);
    }
    else {
      local_d0._16_8_ = pSVar13->str_;
      local_d0._0_8_ = (StringPiece *)*plVar5;
    }
    local_d0._8_8_ = plVar5[1];
    *plVar5 = (long)pSVar13;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)local_d0);
    if ((StringPiece *)local_d0._0_8_ != (StringPiece *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,(ulong)((long)(char **)local_d0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = false;
LAB_00119828:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  ScopedMetric::~ScopedMetric(&local_48);
  return bVar2;
}

Assistant:

bool ImplicitDepLoader::LoadDepFile(Edge* edge, const string& path,
                                    string* err) {
  METRIC_RECORD("depfile load");
  // Read depfile content.  Treat a missing depfile as empty.
  string content;
  switch (disk_interface_->ReadFile(path, &content, err)) {
  case DiskInterface::Okay:
    break;
  case DiskInterface::NotFound:
    err->clear();
    break;
  case DiskInterface::OtherError:
    *err = "loading '" + path + "': " + *err;
    return false;
  }
  // On a missing depfile: return false and empty *err.
  if (content.empty()) {
    EXPLAIN("depfile '%s' is missing", path.c_str());
    return false;
  }

  DepfileParser depfile(depfile_parser_options_
                        ? *depfile_parser_options_
                        : DepfileParserOptions());
  string depfile_err;
  if (!depfile.Parse(&content, &depfile_err)) {
    *err = path + ": " + depfile_err;
    return false;
  }

  if (depfile.outs_.empty()) {
    *err = path + ": no outputs declared";
    return false;
  }

  uint64_t unused;
  std::vector<StringPiece>::iterator primary_out = depfile.outs_.begin();
  if (!CanonicalizePath(const_cast<char*>(primary_out->str_),
                        &primary_out->len_, &unused, err)) {
    *err = path + ": " + *err;
    return false;
  }

  // Check that this depfile matches the edge's output, if not return false to
  // mark the edge as dirty.
  Node* first_output = edge->outputs_[0];
  StringPiece opath = StringPiece(first_output->path());
  if (opath != *primary_out) {
    EXPLAIN("expected depfile '%s' to mention '%s', got '%s'", path.c_str(),
            first_output->path().c_str(), primary_out->AsString().c_str());
    return false;
  }

  // Ensure that all mentioned outputs are outputs of the edge.
  for (std::vector<StringPiece>::iterator o = depfile.outs_.begin();
       o != depfile.outs_.end(); ++o) {
    matches m(o);
    if (std::find_if(edge->outputs_.begin(), edge->outputs_.end(), m) == edge->outputs_.end()) {
      *err = path + ": depfile mentions '" + o->AsString() + "' as an output, but no such output was declared";
      return false;
    }
  }

  // Preallocate space in edge->inputs_ to be filled in below.
  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, depfile.ins_.size());

  // Add all its in-edges.
  for (vector<StringPiece>::iterator i = depfile.ins_.begin();
       i != depfile.ins_.end(); ++i, ++implicit_dep) {
    uint64_t slash_bits;
    if (!CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits,
                          err))
      return false;

    Node* node = state_->GetNode(*i, slash_bits);
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }

  return true;
}